

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.h
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::EvaluateSectionFrame
          (ChElementBeamIGA *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint i;
  long lVar8;
  double *pdVar9;
  pointer psVar10;
  element_type *peVar11;
  pointer psVar12;
  long lVar13;
  ulong uVar14;
  pointer psVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ChVectorDynamic<> N;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  double local_38;
  double local_30;
  double local_28;
  
  i = this->order;
  lVar16 = (long)(int)i;
  if ((-1 < lVar16) &&
     (lVar8 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows, lVar16 < lVar8)) {
    lVar13 = (int)~i + lVar8;
    local_28 = eta;
    if ((-1 < lVar13) && (lVar13 < lVar8)) {
      pdVar9 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      local_30 = pdVar9[lVar16];
      local_38 = pdVar9[lVar13];
      local_48.m_storage.m_data = (double *)0x0;
      local_48.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_48,
                 (long)(int)((ulong)((long)(this->nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4));
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_30;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_38 - local_30;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (local_28 + 1.0) * 0.5;
      auVar18 = vfmadd213sd_fma(auVar18,auVar22,auVar25);
      geometry::ChBasisToolsBspline::BasisEvaluate
                (this->order,i,auVar18._0_8_,&this->knots,(ChVectorDynamic<> *)&local_48);
      if (point != (ChVector<double> *)&VNULL) {
        point->m_data[0] = VNULL;
        point->m_data[1] = DAT_00b90ac0;
        point->m_data[2] = DAT_00b90ac8;
      }
      psVar12 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar10 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar16 = (long)psVar10 - (long)psVar12 >> 4;
      if (psVar10 != psVar12) {
        dVar17 = point->m_data[0];
        dVar1 = point->m_data[1];
        dVar2 = point->m_data[2];
        uVar14 = 0;
        psVar15 = psVar12;
        do {
          if ((~(local_48.m_storage.m_rows >> 0x3f) & local_48.m_storage.m_rows) == uVar14)
          goto LAB_006a44b0;
          dVar3 = local_48.m_storage.m_data[uVar14];
          peVar11 = (psVar15->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          dVar17 = dVar3 * *(double *)&(peVar11->super_ChNodeFEAbase).field_0x20 + dVar17;
          dVar1 = dVar3 * *(double *)&peVar11->field_0x28 + dVar1;
          dVar2 = dVar3 * *(double *)&peVar11->field_0x30 + dVar2;
          point->m_data[0] = dVar17;
          point->m_data[1] = dVar1;
          point->m_data[2] = dVar2;
          uVar14 = uVar14 + 1;
          psVar15 = psVar15 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != uVar14);
      }
      if (rot != (ChQuaternion<double> *)&QNULL) {
        rot->m_data[0] = QNULL;
        rot->m_data[1] = DAT_00b90958;
        rot->m_data[2] = DAT_00b90960;
        rot->m_data[3] = DAT_00b90968;
      }
      if (psVar10 != psVar12) {
        auVar21 = ZEXT864((ulong)rot->m_data[0]);
        auVar24 = ZEXT864((ulong)rot->m_data[1]);
        auVar27 = ZEXT864((ulong)rot->m_data[2]);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = rot->m_data[3];
        uVar14 = 0;
        do {
          if ((~(local_48.m_storage.m_rows >> 0x3f) & local_48.m_storage.m_rows) == uVar14)
          goto LAB_006a44b0;
          peVar11 = (psVar12->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)&peVar11->field_0x50;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)&peVar11->field_0x40;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)&peVar11->field_0x48;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_48.m_storage.m_data[uVar14];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)&peVar11->field_0x38;
          auVar18 = vfmadd231sd_fma(auVar21._0_16_,auVar32,auVar4);
          auVar21 = ZEXT1664(auVar18);
          rot->m_data[0] = auVar18._0_8_;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_48.m_storage.m_data[uVar14];
          auVar18 = vfmadd231sd_fma(auVar24._0_16_,auVar30,auVar5);
          auVar24 = ZEXT1664(auVar18);
          rot->m_data[1] = auVar18._0_8_;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_48.m_storage.m_data[uVar14];
          auVar18 = vfmadd231sd_fma(auVar27._0_16_,auVar31,auVar6);
          auVar27 = ZEXT1664(auVar18);
          rot->m_data[2] = auVar18._0_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_48.m_storage.m_data[uVar14];
          auVar28 = vfmadd231sd_fma(auVar28,auVar29,auVar7);
          rot->m_data[3] = auVar28._0_8_;
          uVar14 = uVar14 + 1;
          psVar12 = psVar12 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != uVar14);
      }
      auVar19._8_8_ = 0;
      auVar19._0_8_ = rot->m_data[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = rot->m_data[1] * rot->m_data[1];
      auVar18 = vfmadd231sd_fma(auVar23,auVar19,auVar19);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = rot->m_data[2];
      auVar18 = vfmadd213sd_fma(auVar26,auVar26,auVar18);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = rot->m_data[3];
      auVar18 = vfmadd213sd_fma(auVar20,auVar20,auVar18);
      if (auVar18._0_8_ < 0.0) {
        dVar17 = sqrt(auVar18._0_8_);
      }
      else {
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        dVar17 = auVar18._0_8_;
      }
      if (dVar17 < 2.2250738585072014e-308) {
        rot->m_data[0] = 1.0;
        rot->m_data[1] = 0.0;
        rot->m_data[2] = 0.0;
        dVar17 = 0.0;
      }
      else {
        dVar17 = 1.0 / dVar17;
        rot->m_data[0] = dVar17 * rot->m_data[0];
        rot->m_data[1] = dVar17 * rot->m_data[1];
        rot->m_data[2] = dVar17 * rot->m_data[2];
        dVar17 = dVar17 * rot->m_data[3];
      }
      rot->m_data[3] = dVar17;
      if (local_48.m_storage.m_data != (double *)0x0) {
        free((void *)local_48.m_storage.m_data[-1]);
      }
      return;
    }
  }
LAB_006a44b0:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual void EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) override {
        // compute parameter in knot space from eta-1..+1

        double u1 = knots(order);  // extreme of span
        double u2 = knots(knots.size() - order - 1);
        double u = u1 + ((eta + 1) / 2.0) * (u2 - u1);
        int nspan = order;

        ChVectorDynamic<> N((int)nodes.size());

        geometry::ChBasisToolsBspline::BasisEvaluate(this->order, nspan, u, knots,
                                                     N);  ///< here return  in N

        point = VNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            point += N(i) * nodes[i]->coord.pos;
        }
        rot = QNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> myrot = nodes[i]->coord.rot;
            rot.e0() += N(i) * myrot.e0();
            rot.e1() += N(i) * myrot.e1();
            rot.e2() += N(i) * myrot.e2();
            rot.e3() += N(i) * myrot.e3();
        }
        rot.Normalize();
    }